

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctaes.c
# Opt level: O2

void SaveBytes(uchar *data16,AES_state *s)

{
  long lVar1;
  int iVar2;
  int b;
  long lVar3;
  int r;
  int iVar4;
  uint8_t v;
  byte bVar5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  for (iVar2 = 0; iVar2 != 4; iVar2 = iVar2 + 1) {
    for (iVar4 = 0; iVar4 != 4; iVar4 = iVar4 + 1) {
      bVar5 = 0;
      for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
        bVar5 = bVar5 | ((s->slice[lVar3] >> (iVar2 + iVar4 * 4 & 0x1fU) & 1) != 0) <<
                        ((byte)lVar3 & 0x1f);
      }
      *data16 = bVar5;
      data16 = data16 + 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void SaveBytes(unsigned char* data16, const AES_state *s) {
    int c;
    for (c = 0; c < 4; c++) {
        int r;
        for (r = 0; r < 4; r++) {
            int b;
            uint8_t v = 0;
            for (b = 0; b < 8; b++) {
                v |= ((s->slice[b] >> (r * 4 + c)) & 1) << b;
            }
            *(data16++) = v;
        }
    }
}